

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::pixie::FieldTypeMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldTypeMethods *this,FieldTypeEnum field_type)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x49) {
    if (iVar2 == 0x20) {
      pcVar3 = "DISCARD";
      pcVar1 = "";
      goto LAB_0017e2e9;
    }
  }
  else {
    if (iVar2 == 0x49) {
      pcVar3 = "INTEGER";
      pcVar1 = "";
      goto LAB_0017e2e9;
    }
    if (iVar2 == 0x4c) {
      pcVar3 = "LONG";
      pcVar1 = "";
      goto LAB_0017e2e9;
    }
    if (iVar2 == 0x53) {
      pcVar3 = "STRING";
      pcVar1 = "";
      goto LAB_0017e2e9;
    }
  }
  pcVar3 = "DOUBLE";
  pcVar1 = "";
LAB_0017e2e9:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldTypeMethods::ToString(FieldTypeEnum field_type)
{
    switch (field_type)
    {
        case FieldTypeEnum::DOUBLE:
            return "DOUBLE";
        case FieldTypeEnum::INTEGER:
            return "INTEGER";
        case FieldTypeEnum::LONG:
            return "LONG";
        case FieldTypeEnum::STRING:
            return "STRING";
        case FieldTypeEnum::DISCARD:
            return "DISCARD";
        default:
            return "DOUBLE";
    }
}